

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O1

int check_ecdsa(u8 *Q,u8 *R,u8 *S,u8 *hash,int isSHA256)

{
  byte bVar1;
  undefined8 uVar2;
  int j;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  byte bVar7;
  uint uVar8;
  bool bVar9;
  u8 e [30];
  u8 r1 [60];
  u8 Sinv [30];
  u8 w2 [30];
  u8 w1 [30];
  u8 r2 [60];
  undefined8 uStack_138;
  undefined2 uStack_130;
  undefined4 uStack_12e;
  undefined2 local_12a;
  undefined2 uStack_128;
  undefined4 uStack_126;
  undefined4 uStack_122;
  undefined4 uStack_11e;
  byte local_118 [64];
  u8 local_d8 [32];
  u8 local_b8 [32];
  u8 local_98 [32];
  u8 local_78 [72];
  
  bn_inv(local_d8,S,ec_N,0x1e);
  uStack_138 = 0;
  uStack_130 = 0;
  if (isSHA256 == 0) {
    uStack_11e = *(undefined4 *)(hash + 0x10);
    uVar2 = *(undefined8 *)hash;
    uStack_12e = (undefined4)uVar2;
    local_12a = (undefined2)((ulong)uVar2 >> 0x20);
    uStack_128 = (undefined2)((ulong)uVar2 >> 0x30);
    uStack_126 = (undefined4)*(undefined8 *)(hash + 8);
    uStack_122 = (undefined4)((ulong)*(undefined8 *)(hash + 8) >> 0x20);
  }
  else {
    iVar3 = 0;
    do {
      lVar6 = 0;
      bVar7 = 0;
      do {
        bVar1 = hash[lVar6];
        hash[lVar6] = bVar7 << 7 | bVar1 >> 1;
        lVar6 = lVar6 + 1;
        bVar7 = bVar1;
      } while (lVar6 != 0x20);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 7);
    uStack_138 = *(undefined8 *)hash;
    uVar2 = *(undefined8 *)(hash + 8);
    uStack_128 = (undefined2)((ulong)*(undefined8 *)(hash + 0xe) >> 0x10);
    uStack_126 = (undefined4)((ulong)*(undefined8 *)(hash + 0xe) >> 0x20);
    uStack_122 = (undefined4)*(undefined8 *)(hash + 0x16);
    uStack_11e = (undefined4)((ulong)*(undefined8 *)(hash + 0x16) >> 0x20);
    uStack_130 = (undefined2)uVar2;
    uStack_12e = (undefined4)((ulong)uVar2 >> 0x10);
    local_12a = (undefined2)((ulong)uVar2 >> 0x30);
  }
  bn_mul(local_98,(u8 *)&uStack_138,local_d8,ec_N,0x1e);
  bn_mul(local_b8,R,local_d8,ec_N,0x1e);
  point_mul(local_118,local_98,ec_G);
  point_mul(local_78,local_b8,Q);
  point_add(local_118,local_118,local_78);
  lVar6 = 0;
  do {
    bVar7 = local_118[lVar6];
    bVar1 = ec_N[lVar6];
    if (bVar7 < bVar1) goto LAB_001026d4;
  } while ((bVar7 <= bVar1) && (bVar9 = lVar6 != 0x1d, lVar6 = lVar6 + 1, bVar9));
  if (bVar1 <= bVar7) {
    uVar5 = 0;
    uVar4 = 0x1d;
    do {
      uVar8 = ec_N[uVar4] + uVar5;
      uVar5 = (uint)(local_118[uVar4] < uVar8);
      local_118[uVar4] = local_118[uVar4] - (char)uVar8;
      uVar4 = uVar4 - 1;
    } while (uVar4 < 0x1e);
  }
LAB_001026d4:
  lVar6 = 0;
  do {
    if (local_118[lVar6] != R[lVar6]) {
      return 0;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x1e);
  return 1;
}

Assistant:

int check_ecdsa(u8 *Q, u8 *R, u8 *S, u8 *hash, int isSHA256)
{
	u8 Sinv[30];
	u8 e[30];
	u8 w1[30], w2[30];
	u8 r1[60], r2[60];

	bn_inv(Sinv, S, ec_N, 30);

	elt_zero(e);

	if (isSHA256)
	{
		bn_shiftr(hash, 32, 7);  //shift right 7 bits.
		memcpy(e, hash, 30);     //then shift 16 more bits right by cutting off the last two bytes of 32 byte sha256.
    	                         //this gets our bignum sha256 hash to fit in the 233 bit limit of this ecdsa curve.
	}
	else
	{
		// Simon - New addition: added support for SHA1, very insecure as top 80 bits are always zeroes
		memcpy(e + 10, hash, 20);
	}

	bn_mul(w1, e, Sinv, ec_N, 30);
	bn_mul(w2, R, Sinv, ec_N, 30);

	point_mul(r1, w1, ec_G);
	point_mul(r2, w2, Q);

	point_add(r1, r1, r2);

	if (bn_compare(r1, ec_N, 30) >= 0)
		bn_sub_modulus(r1, ec_N, 30);

	return (bn_compare(r1, R, 30) == 0);
}